

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_getForce.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::getForce
          (NavierStokesBase *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,
          FArrayBox *State,FArrayBox *Aux,int auxScomp,MFIter *param_9)

{
  Box *pBVar1;
  Box *subbox;
  ostringstream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  long lVar12;
  int iVar13;
  double *pdVar14;
  double *pdVar15;
  NumComps ncomp_00;
  long lVar16;
  long lVar17;
  double *pdVar18;
  int iVar19;
  double *pdVar20;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  DestComp local_26c;
  Print local_238;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  double *local_60;
  double *local_58;
  long local_50;
  Real local_48;
  undefined8 uStack_40;
  
  uVar21 = (ulong)(uint)scomp;
  local_26c.i = 0;
  amrex::BaseFab<double>::dataPtr(&State->super_BaseFab<double>,0);
  amrex::BaseFab<double>::dataPtr(&Aux->super_BaseFab<double>,auxScomp);
  local_48 = gravity;
  uStack_40 = 0;
  if ((*(int *)(amrex::ParallelContext::frames + 0xc) == 0) && (getForceVerbose != 0)) {
    local_238.os = amrex::OutStream();
    poVar2 = &local_238.ss;
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::getForce(): Entered...",0x28);
    cVar11 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"time      = ",0xc);
    std::ostream::_M_insert<double>(time);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"scomp     = ",0xc);
    std::ostream::operator<<(poVar2,scomp);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"ncomp     = ",0xc);
    std::ostream::operator<<(poVar2,ncomp);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"auxScomp = ",0xb);
    std::ostream::operator<<(poVar2,auxScomp);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    if (ncomp == 1) {
      local_238.os = amrex::OutStream();
      local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      local_238.rank = *(int *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
           *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Doing only component ",0x15);
      std::ostream::operator<<(poVar2,scomp);
      std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
      std::ostream::put(cVar11);
      std::ostream::flush();
LAB_00248d75:
      amrex::Print::~Print(&local_238);
    }
    else {
      if (ncomp == 3 && scomp == 0) {
        local_238.os = amrex::OutStream();
        local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        local_238.rank = *(int *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
             *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Doing velocities only",0x15);
        std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
        std::ostream::put(cVar11);
        std::ostream::flush();
        goto LAB_00248d75;
      }
      if (2 < scomp) {
        local_238.os = amrex::OutStream();
        local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        local_238.rank = *(int *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
             *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Doing ",6);
        std::ostream::operator<<(poVar2,ncomp);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2," component(s) starting with component ",0x26);
        std::ostream::operator<<(poVar2,scomp);
        std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
        std::ostream::put(cVar11);
        std::ostream::flush();
        goto LAB_00248d75;
      }
    }
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::getForce(): Filling Force on box:",0x33);
    amrex::operator<<((ostream *)poVar2,bx);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::getForce(): Force Domain:",0x2b);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
    std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.smallend.vect[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.smallend.vect[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.smallend.vect[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") - ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
    std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.bigend.vect[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.bigend.vect[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.bigend.vect[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::getForce(): Vel Domain:",0x29);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
    pBVar1 = &(State->super_BaseFab<double>).domain;
    std::ostream::operator<<(poVar2,(pBVar1->smallend).vect[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.smallend.vect[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.smallend.vect[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") - ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
    std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.bigend.vect[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.bigend.vect[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.bigend.vect[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::getForce(): Scal Domain:",0x2a);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
    subbox = &(Aux->super_BaseFab<double>).domain;
    std::ostream::operator<<(poVar2,(subbox->smallend).vect[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.smallend.vect[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.smallend.vect[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") - ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
    std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.bigend.vect[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.bigend.vect[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
    std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.bigend.vect[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
    iVar19 = scomp;
    iVar13 = ncomp;
    if (0 < ncomp) {
      do {
        local_238.os = amrex::OutStream();
        local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        local_238.rank = *(int *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
             *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"State comp ",0xb);
        std::ostream::operator<<(poVar2,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," min/max ",9);
        dVar23 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                           (&State->super_BaseFab<double>,pBVar1,iVar19);
        std::ostream::_M_insert<double>(dVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
        dVar23 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                           (&State->super_BaseFab<double>,pBVar1,iVar19);
        std::ostream::_M_insert<double>(dVar23);
        std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
        std::ostream::put(cVar11);
        std::ostream::flush();
        amrex::Print::~Print(&local_238);
        iVar13 = iVar13 + -1;
        iVar19 = iVar19 + 1;
      } while (iVar13 != 0);
    }
    if (auxScomp < (Aux->super_BaseFab<double>).nvar) {
      iVar19 = auxScomp;
      do {
        local_238.os = amrex::OutStream();
        local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        local_238.rank = *(int *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
             *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"aux comp ",9);
        std::ostream::operator<<(poVar2,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," min/max ",9);
        dVar23 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                           (&Aux->super_BaseFab<double>,subbox,iVar19);
        std::ostream::_M_insert<double>(dVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
        dVar23 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                           (&Aux->super_BaseFab<double>,subbox,iVar19);
        std::ostream::_M_insert<double>(dVar23);
        std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
        std::ostream::put(cVar11);
        std::ostream::flush();
        amrex::Print::~Print(&local_238);
        iVar19 = iVar19 + 1;
      } while (iVar19 < (Aux->super_BaseFab<double>).nvar);
    }
  }
  ncomp_00.n = ncomp;
  if (scomp < 3) {
    if (scomp != 0) {
      amrex::Assert_host("scomp==Xvel",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
                         ,0x7c,(char *)0x0);
    }
    if (ncomp < 3) {
      amrex::Assert_host("ncomp>=AMREX_SPACEDIM",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
                         ,0x7d,(char *)0x0);
    }
    if (scomp == 0) {
      if (ABS(local_48) <= 0.0001) {
        local_238.rank = 0;
        local_238.comm = 0;
        amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                  (&force->super_BaseFab<double>,(double *)&local_238,bx,(DestComp)0x0,(NumComps)0x3
                  );
      }
      else {
        iVar19 = (bx->smallend).vect[2];
        iVar13 = (bx->bigend).vect[2];
        if (iVar19 <= iVar13) {
          iVar3 = (force->super_BaseFab<double>).domain.smallend.vect[0];
          iVar4 = (force->super_BaseFab<double>).domain.smallend.vect[1];
          iVar5 = (force->super_BaseFab<double>).domain.smallend.vect[2];
          lVar12 = (long)iVar5;
          iVar6 = (Aux->super_BaseFab<double>).domain.smallend.vect[0];
          iVar7 = (Aux->super_BaseFab<double>).domain.smallend.vect[1];
          iVar8 = (Aux->super_BaseFab<double>).domain.smallend.vect[2];
          iVar9 = (bx->smallend).vect[1];
          iVar10 = (bx->smallend).vect[0];
          local_60 = (Aux->super_BaseFab<double>).dptr + ((long)iVar10 - (long)iVar6);
          local_68 = (long)iVar9 * 8;
          local_70 = local_68 + (long)iVar7 * -8;
          local_50 = (long)auxScomp *
                     (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[2] - iVar8) + 1) * 8 +
                     (long)iVar8 * -8;
          local_78 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
          local_80 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
          lVar17 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
          local_98 = (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
          local_a0 = (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1);
          local_68 = local_68 + (long)iVar4 * -8;
          local_a8 = lVar17 * 0x10 + lVar12 * -8;
          local_90 = lVar17 * 8 + lVar12 * -8;
          iVar4 = (bx->bigend).vect[0];
          local_58 = (force->super_BaseFab<double>).dptr + ((long)iVar10 - (long)iVar3);
          iVar3 = (bx->bigend).vect[1];
          local_b0 = local_80 * 8;
          do {
            if (iVar9 <= iVar3) {
              lVar17 = (long)iVar19;
              pdVar15 = (double *)
                        (((local_50 + lVar17 * 8) * local_a0 + local_70) * local_98 + (long)local_60
                        );
              pdVar14 = (double *)
                        (((local_a8 + lVar17 * 8) * local_80 + local_68) * local_78 + (long)local_58
                        );
              pdVar18 = (double *)
                        (((local_90 + lVar17 * 8) * local_80 + local_68) * local_78 + (long)local_58
                        );
              pdVar20 = (double *)
                        (((lVar17 - lVar12) * local_b0 + local_68) * local_78 + (long)local_58);
              lVar17 = (long)iVar9;
              do {
                if (iVar10 <= iVar4) {
                  lVar16 = 0;
                  do {
                    pdVar20[lVar16] = 0.0;
                    pdVar18[lVar16] = 0.0;
                    pdVar14[lVar16] = pdVar15[lVar16] * local_48;
                    lVar16 = lVar16 + 1;
                  } while ((iVar4 - iVar10) + 1 != (int)lVar16);
                }
                lVar17 = lVar17 + 1;
                pdVar15 = pdVar15 + local_98;
                pdVar14 = pdVar14 + local_78;
                pdVar18 = pdVar18 + local_78;
                pdVar20 = pdVar20 + local_78;
              } while (iVar3 + 1 != (int)lVar17);
            }
            bVar22 = iVar19 != iVar13;
            iVar19 = iVar19 + 1;
            local_88 = uVar21;
          } while (bVar22);
        }
      }
    }
    if (ncomp + scomp < 4) goto LAB_00249a58;
    ncomp_00.n = ncomp + -3;
    local_26c.i = 3;
  }
  if (0 < ncomp_00.n) {
    local_238.rank = 0;
    local_238.comm = 0;
    amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
              (&force->super_BaseFab<double>,(double *)&local_238,bx,local_26c,ncomp_00);
  }
LAB_00249a58:
  if ((*(int *)(amrex::ParallelContext::frames + 0xc) == 0) && (getForceVerbose != 0)) {
    poVar2 = &local_238.ss;
    cVar11 = (char)poVar2;
    if (0 < ncomp) {
      pBVar1 = &(force->super_BaseFab<double>).domain;
      do {
        local_238.os = amrex::OutStream();
        local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        local_238.rank = *(int *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
             *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Force comp ",0xb);
        iVar19 = (int)uVar21;
        std::ostream::operator<<(poVar2,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," min/max ",9);
        dVar23 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                           (&force->super_BaseFab<double>,pBVar1,iVar19);
        std::ostream::_M_insert<double>(dVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
        dVar23 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                           (&force->super_BaseFab<double>,pBVar1,iVar19);
        std::ostream::_M_insert<double>(dVar23);
        std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
        std::ostream::put(cVar11);
        std::ostream::flush();
        amrex::Print::~Print(&local_238);
        uVar21 = (ulong)(iVar19 + 1);
        ncomp = ncomp + -1;
      } while (ncomp != 0);
    }
    local_238.os = amrex::OutStream();
    local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_238.rank = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
         *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::getForce(): Leaving...",0x28);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"---",3);
    std::ios::widen((char)*(undefined8 *)(local_238._16_8_ + -0x18) + cVar11);
    std::ostream::put(cVar11);
    std::ostream::flush();
    amrex::Print::~Print(&local_238);
  }
  return;
}

Assistant:

void
NavierStokesBase::getForce (FArrayBox&       force,
                            const Box&       bx,
                            int              scomp,
                            int              ncomp,
                            const Real       time,
                            const FArrayBox& State,
                            const FArrayBox& Aux,
                            int              auxScomp,
                            const MFIter&    /*mfi*/)
{

   const Real* StateDataPtr  = State.dataPtr();
   const Real* auxDataPtr = Aux.dataPtr(auxScomp);

   const Real  grav     = gravity;

   if (ParallelDescriptor::IOProcessor() && getForceVerbose)
   {
       const int*  f_lo     = force.loVect();
       const int*  f_hi     = force.hiVect();
       const int*  v_lo     = State.loVect();
       const int*  v_hi     = State.hiVect();
       const int*  s_lo     = Aux.loVect();
       const int*  s_hi     = Aux.hiVect();
       
       amrex::Print() << "NavierStokesBase::getForce(): Entered..." << std::endl 
		      << "time      = " << time << std::endl
		      << "scomp     = " << scomp << std::endl
		      << "ncomp     = " << ncomp << std::endl
		      << "auxScomp = " << auxScomp << std::endl;
       
       if  (ncomp==1) amrex::Print() << "Doing only component " << scomp << std::endl;
       else if (scomp==0 && ncomp==AMREX_SPACEDIM) amrex::Print() << "Doing velocities only" << std::endl;
       else if (scomp>=AMREX_SPACEDIM) amrex::Print() << "Doing " << ncomp << " component(s) starting with component " << scomp << std::endl;

       amrex::Print() << "NavierStokesBase::getForce(): Filling Force on box:"
		      << bx << std::endl;
#if (AMREX_SPACEDIM == 3)
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << "," << f_lo[2] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << "," << f_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Vel Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << "," << v_lo[2] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << "," << v_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Scal Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << "," << s_lo[2] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << "," << s_hi[2] << ")" << std::endl;
#else
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): State Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Aux Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << ")" << std::endl;
#endif

       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "State comp " << scomp+n << " min/max " 
			  << State.min<RunOn::Gpu>(scomp+n) << " / "
			  << State.max<RunOn::Gpu>(scomp+n) << std::endl;
       }
       for (int n=auxScomp; n<Aux.nComp(); n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "aux comp " << n << " min/max " 
			  << Aux.min<RunOn::Gpu>(n) << " / "
			  << Aux.max<RunOn::Gpu>(n) << std::endl;
       }
   } //end if(getForceVerbose)

   //
   // Here's the meat
   //
   // Velocity forcing
   //
   if ( scomp<AMREX_SPACEDIM ){
       AMREX_ALWAYS_ASSERT(scomp==Xvel);
       AMREX_ALWAYS_ASSERT(ncomp>=AMREX_SPACEDIM);
   }

   if ( scomp==Xvel ){
     //
     // TODO: add some switch for user-supplied/problem-dependent forcing
     //
     auto const& frc = force.array(scomp);
     auto const& aux = Aux.array(auxScomp);

     if ( std::abs(grav) > 0.0001) {
       amrex::ParallelFor(bx, [frc, aux, grav]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
	 frc(i,j,k,0) = Real(0.0);
#if ( AMREX_SPACEDIM == 2 )
         frc(i,j,k,1) = grav*aux(i,j,k,0);
#elif ( AMREX_SPACEDIM == 3 )
         frc(i,j,k,1) = Real(0.0);
         frc(i,j,k,2) = grav*aux(i,j,k,0);
#endif
       });
     }
     else {
       force.setVal<RunOn::Gpu>(0.0, bx, Xvel, AMREX_SPACEDIM);
     }
   }

   //
   // Scalar forcing
   //
   // During a regular timestep, getForce is called on scalars only.
   // During the multilevel sync, scalars are done with velocity.
   //
   int scomp_scal = -1;
   int ncomp_scal = -1;
   if ( scomp >= AMREX_SPACEDIM ) {
       // Doing only scalars
       scomp_scal = 0;
       ncomp_scal = ncomp;
   }
   // Recall that we will only get here if previous block is false,
   // i.e. if scomp < AMREX_SPACEDIM
   else if ( scomp+ncomp > AMREX_SPACEDIM) {
       // Doing scalars with vel
       scomp_scal = Density;
       ncomp_scal = ncomp-Density;
   }

   if (ncomp_scal > 0) {
       force.setVal<RunOn::Gpu>(0.0, bx, scomp_scal, ncomp_scal);
       //
       // Or create user-defined forcing.
       // Recall we compute a density-weighted forcing term.
       //
       // auto const& frc  = force.array(scomp_scal);
       // amrex::ParallelFor(bx, ncomp_scal, [frc]
       // AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       // {
       //          frc(i,j,k,n) = ;
       //          frc(i,j,k,n) *= rho;
       // });
   }
     
   if (ParallelDescriptor::IOProcessor() && getForceVerbose) {
       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "Force comp " << scomp+n << " min/max " 
			  << force.min<RunOn::Gpu>(scomp+n) << " / "
			  << force.max<RunOn::Gpu>(scomp+n) << std::endl;
       }

      amrex::Print() << "NavierStokesBase::getForce(): Leaving..." 
                     << std::endl << "---" << std::endl;
   }
}